

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SinglyLinkedList.h
# Opt level: O1

string * __thiscall
SinglyLinkedList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
toString(string *__return_storage_ptr__,
        SinglyLinkedList<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  long *plVar4;
  size_type *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *n_00;
  node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pnVar6;
  undefined8 uVar7;
  _Alloc_hider _Var8;
  int iVar9;
  string local_98;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  if (this->count == 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else {
    pnVar6 = this->head;
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    iVar3 = this->count;
    if (0 < iVar3) {
      paVar1 = &local_98.field_2;
      iVar9 = 0;
      do {
        if (iVar9 == iVar3 + -1) {
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          pcVar2 = (pnVar6->data)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_78,pcVar2,pcVar2 + (pnVar6->data)._M_string_length);
          libString::to_string<std::__cxx11::string>(&local_98,(libString *)&local_78,n);
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_98._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar1) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          uVar7 = local_78.field_2._M_allocated_capacity;
          _Var8._M_p = local_78._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
LAB_001175e9:
            operator_delete(_Var8._M_p,uVar7 + 1);
          }
        }
        else {
          local_50[0] = &local_40;
          pcVar2 = (pnVar6->data)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_50,pcVar2,pcVar2 + (pnVar6->data)._M_string_length);
          libString::to_string<std::__cxx11::string>(&local_78,(libString *)local_50,n_00);
          plVar4 = (long *)std::__cxx11::string::append((char *)&local_78);
          psVar5 = (size_type *)(plVar4 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar4 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar5) {
            local_98.field_2._M_allocated_capacity = *psVar5;
            local_98.field_2._8_8_ = plVar4[3];
            local_98._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_98.field_2._M_allocated_capacity = *psVar5;
            local_98._M_dataplus._M_p = (pointer)*plVar4;
          }
          local_98._M_string_length = plVar4[1];
          *plVar4 = (long)psVar5;
          plVar4[1] = 0;
          *(undefined1 *)(plVar4 + 2) = 0;
          std::__cxx11::string::_M_append
                    ((char *)__return_storage_ptr__,(ulong)local_98._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar1) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          uVar7 = local_40._M_allocated_capacity;
          _Var8._M_p = (pointer)local_50[0];
          if (local_50[0] != &local_40) goto LAB_001175e9;
        }
        pnVar6 = pnVar6->next;
        iVar9 = iVar9 + 1;
        iVar3 = this->count;
      } while (iVar9 < iVar3);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SinglyLinkedList<T>::toString()
{
	std::string output = "";

	if (count == 0)
	{
		output += "[]\n";
	}


	else
	{
		//start at the head of the list.
		node<T> *currentNode = head;
		output += "[";

		int i = 0;

		for (i = 0; i < count; i++)
		{
			if (i == count - 1)
			{
				output += libString::to_string(currentNode->getData());
			}

			else
			{
				output += libString::to_string(currentNode->getData()) + ", ";
			}

			currentNode = currentNode->getNext();
		}

		output += "]";
	}

	return output;
}